

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readpsm.c
# Opt level: O0

int it_psm_process_sample(IT_SAMPLE *sample,uchar *data,int len,int id,int version)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  char cVar4;
  void *pvVar5;
  uint in_ECX;
  int in_EDX;
  byte *in_RSI;
  void *in_RDI;
  int in_R8D;
  int samplerate;
  int defvol;
  int panpos;
  int loopend;
  int loopstart;
  int length;
  int insno;
  int flags;
  undefined4 local_44;
  uint local_40;
  undefined4 local_38;
  undefined4 local_34;
  int local_30;
  uint local_2c;
  byte *local_18;
  int local_4;
  
  if (in_EDX < 0x60) {
    local_4 = -1;
  }
  else {
    bVar1 = *in_RSI;
    if (in_R8D == 0xe5aba) {
      memcpy(in_RDI,in_RSI + 0xd,0x22);
      *(undefined1 *)((long)in_RDI + 0x22) = 0;
      uVar3 = *(ushort *)(in_RSI + 0x34);
      local_30 = *(int *)(in_RSI + 0x36);
      local_34 = *(undefined4 *)(in_RSI + 0x3a);
      local_38 = *(undefined4 *)(in_RSI + 0x3e);
      bVar2 = in_RSI[0x44];
      local_44 = *(undefined4 *)(in_RSI + 0x49);
    }
    else {
      memcpy(in_RDI,in_RSI + 0x11,0x22);
      *(undefined1 *)((long)in_RDI + 0x22) = 0;
      uVar3 = *(ushort *)(in_RSI + 0x38);
      local_30 = *(int *)(in_RSI + 0x3a);
      local_34 = *(undefined4 *)(in_RSI + 0x3e);
      local_38 = *(undefined4 *)(in_RSI + 0x42);
      bVar2 = in_RSI[0x49];
      local_44 = *(undefined4 *)(in_RSI + 0x4e);
    }
    local_2c = (uint)uVar3;
    local_40 = (uint)bVar2;
    if (local_2c == in_ECX) {
      if (local_30 == 0) {
        *(byte *)((long)in_RDI + 0x32) = *(byte *)((long)in_RDI + 0x32) & 0xfe;
        local_4 = 0;
      }
      else if ((in_EDX + -0x60 < local_30) || ((bVar1 & 0x7f) != 0)) {
        local_4 = -1;
      }
      else {
        *(undefined1 *)((long)in_RDI + 0x32) = 1;
        *(int *)((long)in_RDI + 0x38) = local_30;
        *(undefined4 *)((long)in_RDI + 0x3c) = local_34;
        *(undefined4 *)((long)in_RDI + 0x40) = local_38;
        *(undefined4 *)((long)in_RDI + 0x44) = local_44;
        *(char *)((long)in_RDI + 0x34) = (char)((int)local_40 >> 1);
        *(undefined1 *)((long)in_RDI + 0x35) = 0;
        *(undefined1 *)((long)in_RDI + 0x23) = 0;
        *(undefined1 *)((long)in_RDI + 0x33) = 0x40;
        *(undefined1 *)((long)in_RDI + 0x50) = 0;
        *(undefined1 *)((long)in_RDI + 0x51) = 0;
        *(undefined1 *)((long)in_RDI + 0x52) = 0;
        *(undefined1 *)((long)in_RDI + 0x53) = 0;
        *(undefined2 *)((long)in_RDI + 0x54) = 0;
        *(undefined4 *)((long)in_RDI + 0x60) = 0xffffffff;
        if ((((bVar1 & 0x80) != 0) &&
            (*(uint *)((long)in_RDI + 0x40) <= *(uint *)((long)in_RDI + 0x38))) &&
           (*(uint *)((long)in_RDI + 0x3c) < *(uint *)((long)in_RDI + 0x40))) {
          *(undefined4 *)((long)in_RDI + 0x38) = *(undefined4 *)((long)in_RDI + 0x40);
          *(byte *)((long)in_RDI + 0x32) = *(byte *)((long)in_RDI + 0x32) | 0x10;
        }
        pvVar5 = malloc((long)*(int *)((long)in_RDI + 0x38));
        *(void **)((long)in_RDI + 0x58) = pvVar5;
        if (*(long *)((long)in_RDI + 0x58) == 0) {
          local_4 = -1;
        }
        else {
          cVar4 = '\0';
          local_18 = in_RSI + 0x60;
          for (local_2c = 0; (int)local_2c < *(int *)((long)in_RDI + 0x38); local_2c = local_2c + 1)
          {
            cVar4 = *local_18 + cVar4;
            *(char *)(*(long *)((long)in_RDI + 0x58) + (long)(int)local_2c) = cVar4;
            local_18 = local_18 + 1;
          }
          local_4 = 0;
        }
      }
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static int it_psm_process_sample(IT_SAMPLE * sample, const unsigned char * data, int len, int id, int version) {
	int flags;
	int insno = 0;
	int length = 0;
	int loopstart = 0;
	int loopend = 0;
	int panpos;
	int defvol = 0;
	int samplerate = 0;

	if (len < 0x60) return -1;

	flags = data[0];

	if (version == PSMV_OLD) {
		memcpy(sample->name, data + 0x0D, 34);
		sample->name[34] = 0;

		insno = data[0x34] | (data[0x35] << 8);
		length = data[0x36] | (data[0x37] << 8) | (data[0x38] << 16) | (data[0x39] << 24);
		loopstart = data[0x3A] | (data[0x3B] << 8) | (data[0x3C] << 16) | (data[0x3D] << 24);
		loopend = data[0x3E] | (data[0x3F] << 8) | (data[0x40] << 16) | (data[0x41] << 24);
		panpos = data[0x43];
		defvol = data[0x44];
		samplerate = data[0x49] | (data[0x4A] << 8) | (data[0x4B] << 16) | (data[0x4C] << 24);
	} else /*if (version == PSMV_NEW)*/ {
		memcpy(sample->name, data + 0x11, 34);
		sample->name[34] = 0;

		insno = data[0x38] | (data[0x39] << 8);
		length = data[0x3A] | (data[0x3B] << 8) | (data[0x3C] << 16) | (data[0x3D] << 24);
		loopstart = data[0x3E] | (data[0x3F] << 8) | (data[0x40] << 16) | (data[0x41] << 24);
		loopend = data[0x42] | (data[0x43] << 8) | (data[0x44] << 16) | (data[0x45] << 24);
		panpos = data[0x48];
		defvol = data[0x49];
		samplerate = data[0x4E] | (data[0x4F] << 8) | (data[0x50] << 16) | (data[0x51] << 24);
	}

	if (insno != id) return -1;

	if (!length) {
		sample->flags &= ~IT_SAMPLE_EXISTS;
		return 0;
	}
	
	if ((length > len - 0x60) || ((flags & 0x7F) != 0)) return -1;

	sample->flags = IT_SAMPLE_EXISTS;
	sample->length = length;
	sample->loop_start = loopstart;
	sample->loop_end = loopend;
	sample->C5_speed = samplerate;
	sample->default_volume = defvol >> 1;
	sample->default_pan = 0;
	sample->filename[0] = 0;
	sample->global_volume = 64;
	sample->vibrato_speed = 0;
	sample->vibrato_depth = 0;
	sample->vibrato_rate = 0;
	sample->vibrato_waveform = IT_VIBRATO_SINE;
	sample->finetune = 0;
	sample->max_resampling_quality = -1;

	if (flags & 0x80) {
		if (((unsigned int)sample->loop_end <= (unsigned int)sample->length) &&
			((unsigned int)sample->loop_start < (unsigned int)sample->loop_end)) {
			sample->length = sample->loop_end;
			sample->flags |= IT_SAMPLE_LOOP;
		}
	}

	sample->data = malloc(sample->length);
	if (!sample->data)
		return -1;

	flags = 0;
	data += 0x60;

	for (insno = 0; insno < sample->length; insno++) {
		flags += (signed char)(*data++);
		((signed char *)sample->data)[insno] = flags;
	}

	return 0;
}